

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::SerializeWithCachedSizes
          (CodeGeneratorResponse *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  char *data;
  string *value;
  CodeGeneratorResponse_File *value_00;
  UnknownFieldSet *pUVar3;
  int local_1c;
  int i;
  CodedOutputStream *output_local;
  CodeGeneratorResponse *this_local;
  
  bVar1 = has_error(this);
  if (bVar1) {
    error_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    error_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(data,iVar2,SERIALIZE);
    value = error_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(1,value,output);
  }
  for (local_1c = 0; iVar2 = file_size(this), local_1c < iVar2; local_1c = local_1c + 1) {
    value_00 = file(this,local_1c);
    internal::WireFormatLite::WriteMessageMaybeToArray(0xf,(MessageLite *)value_00,output);
  }
  pUVar3 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar3);
  if (!bVar1) {
    pUVar3 = unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(pUVar3,output);
  }
  return;
}

Assistant:

void CodeGeneratorResponse::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // optional string error = 1;
  if (has_error()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->error().data(), this->error().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->error(), output);
  }

  // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
  for (int i = 0; i < this->file_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      15, this->file(i), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}